

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ProcessNoImplicitCallUses(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  StackSym *stackSym;
  SymOpnd *pSVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  RegOpnd *pRStack_60;
  ValueType valueType;
  RegOpnd *regSrc;
  Sym *sym;
  ArrayRegOpnd *arraySrc;
  Opnd *src;
  Opnd *pOStack_38;
  int i;
  Opnd *srcs [2];
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1134,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->m_opcode == NoImplicitCallUses) {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetDst(instr);
    if (pOVar6 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113b,"(!instr->GetDst())","!instr->GetDst()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    if (pOVar6 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113c,"(instr->GetSrc1())","instr->GetSrc1()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
    if (!bVar2) {
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar2 = IR::Opnd::IsSymOpnd(pOVar6);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x113d,
                           "(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd())",
                           "instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetSrc2(instr);
      bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
      if (!bVar2) {
        pOVar6 = IR::Instr::GetSrc2(instr);
        bVar2 = IR::Opnd::IsSymOpnd(pOVar6);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x113e,
                             "(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd())"
                             ,
                             "!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd()"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
    bVar2 = IsCollectionPass(this);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      pOStack_38 = IR::Instr::GetSrc1(instr);
      srcs[0] = IR::Instr::GetSrc2(instr);
      src._4_4_ = 0;
      while( true ) {
        bVar2 = false;
        if (src._4_4_ < 2) {
          bVar2 = *(long *)((long)&stack0xffffffffffffffc8 + (long)(int)src._4_4_ * 8) != 0;
        }
        if (!bVar2) break;
        pOVar6 = *(Opnd **)((long)&stack0xffffffffffffffc8 + (long)(int)src._4_4_ * 8);
        sym = (Sym *)0x0;
        regSrc = (RegOpnd *)0x0;
        OVar3 = IR::Opnd::GetKind(pOVar6);
        if (OVar3 == OpndKindSym) {
          pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
          regSrc = (RegOpnd *)pSVar7->m_sym;
          bVar2 = Sym::IsPropertySym((Sym *)regSrc);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x115e,"(sym->IsPropertySym())","sym->IsPropertySym()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
        else if (OVar3 == OpndKindReg) {
          pRStack_60 = IR::Opnd::AsRegOpnd(pOVar6);
          regSrc = (RegOpnd *)pRStack_60->m_sym;
          BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->considerSymsAsRealUsesInNoImplicitCallUses,
                             (((StackSym *)regSrc)->super_Sym).m_id);
          if (BVar4 != '\0') {
            stackSym = Sym::AsStackSym((Sym *)regSrc);
            ProcessStackSymUse(this,stackSym,'\x01');
          }
          bVar2 = IR::RegOpnd::IsArrayRegOpnd(pRStack_60);
          if (bVar2) {
            sym = (Sym *)IR::RegOpnd::AsArrayRegOpnd(pRStack_60);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1162,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallUses,*(BVIndex *)&regSrc->m_sym);
        local_62.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(pOVar6);
        bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_62.field_0);
        if (bVar2) {
          bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_62.field_0);
          if (bVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNoMissingValuesUses,
                       *(BVIndex *)&regSrc->m_sym);
          }
          bVar2 = ValueType::HasVarElements((ValueType *)&local_62.field_0);
          if (!bVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNativeArrayUses,*(BVIndex *)&regSrc->m_sym)
            ;
          }
          if (sym != (Sym *)0x0) {
            ProcessArrayRegOpndUse(this,instr,(ArrayRegOpnd *)sym);
          }
        }
        src._4_4_ = src._4_4_ + 1;
      }
      bVar2 = IsPrePass(this);
      if (!bVar2) {
        BasicBlock::RemoveInstr(this->currentBlock,instr);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::ProcessNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(instr);

    if(instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        return false;
    }
    Assert(tag == Js::DeadStorePhase);
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd());
    Assert(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd());

    if(IsCollectionPass())
    {
        return true;
    }

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]) && srcs[i]; ++i)
    {
        IR::Opnd *const src = srcs[i];
        IR::ArrayRegOpnd *arraySrc = nullptr;
        Sym *sym = nullptr;
        switch(src->GetKind())
        {
            case IR::OpndKindReg:
            {
                IR::RegOpnd *const regSrc = src->AsRegOpnd();
                sym = regSrc->m_sym;
                if(considerSymsAsRealUsesInNoImplicitCallUses->TestAndClear(sym->m_id))
                {
                    ProcessStackSymUse(sym->AsStackSym(), true);
                }
                if(regSrc->IsArrayRegOpnd())
                {
                    arraySrc = regSrc->AsArrayRegOpnd();
                }
                break;
            }

            case IR::OpndKindSym:
                sym = src->AsSymOpnd()->m_sym;
                Assert(sym->IsPropertySym());
                break;

            default:
                Assert(false);
                __assume(false);
        }

        currentBlock->noImplicitCallUses->Set(sym->m_id);
        const ValueType valueType(src->GetValueType());
        if(valueType.IsArrayOrObjectWithArray())
        {
            if(valueType.HasNoMissingValues())
            {
                currentBlock->noImplicitCallNoMissingValuesUses->Set(sym->m_id);
            }
            if(!valueType.HasVarElements())
            {
                currentBlock->noImplicitCallNativeArrayUses->Set(sym->m_id);
            }
            if(arraySrc)
            {
                ProcessArrayRegOpndUse(instr, arraySrc);
            }
        }
    }

    if(!IsPrePass())
    {
        currentBlock->RemoveInstr(instr);
    }
    return true;
}